

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

int INT_EVdfg_unlink_port(EVdfg_stone src,int port)

{
  EVdfg_config_action act_00;
  int iVar1;
  EVdfg_config_action act;
  undefined8 uStack_18;
  undefined4 uStack_c;
  undefined8 uStack_8;
  
  if (-1 < port) {
    act_00.stone_id = src->stone_id;
    act_00.type = 6;
    act_00.u.period.usecs = uStack_c;
    act_00.u.period.secs = port;
    act_00._8_8_ = uStack_18;
    act_00.u._8_8_ = uStack_8;
    iVar1 = EVdfg_perform_act_on_state(src->dfg->working_state,act_00,1);
    return iVar1;
  }
  return 0;
}

Assistant:

extern int
INT_EVdfg_unlink_port(EVdfg_stone src, int port)
{
    EVdfg_config_action act;
    if (port < 0) return 0;
    act.type = ACT_unlink_port;
    act.stone_id = src->stone_id;
    act.u.link.port = port;
    return EVdfg_perform_act_on_state(src->dfg->working_state, act, 1 /* add to queue */);
}